

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int UTF8ToUTF16LE(uchar *outb,int *outlen,uchar *in,int *inlen)

{
  ushort *puVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  uchar *processed;
  uint uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  unsigned_short *out;
  byte *pbVar9;
  byte *pbVar10;
  
  iVar8 = (int)outb;
  iVar4 = (int)in;
  iVar6 = -1;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && outb != (uchar *)0x0)) {
    if (in != (uchar *)0x0) {
      if (0 < (long)*inlen) {
        pbVar9 = in + *inlen;
        puVar1 = (ushort *)(outb + (long)(*outlen / 2) * 2);
        do {
          bVar2 = *in;
          uVar5 = (uint)bVar2;
          lVar7 = 0;
          if ((char)bVar2 < '\0') {
            if (bVar2 < 0xc0) {
LAB_001444c4:
              *outlen = (int)outb - iVar8;
              *inlen = (int)in - iVar4;
              return -2;
            }
            if (bVar2 < 0xe0) {
              uVar5 = bVar2 & 0x1f;
              lVar7 = 1;
            }
            else if (bVar2 < 0xf0) {
              uVar5 = bVar2 & 0xf;
              lVar7 = 2;
            }
            else {
              if (0xf7 < bVar2) goto LAB_001444c4;
              uVar5 = bVar2 & 7;
              lVar7 = 3;
            }
          }
          pbVar10 = in + 1;
          iVar6 = (int)lVar7;
          if ((long)pbVar9 - (long)pbVar10 < lVar7) break;
          if (pbVar10 < pbVar9 && (char)bVar2 < '\0') {
            pbVar3 = in + 2;
            do {
              pbVar10 = pbVar3;
              iVar6 = iVar6 + -1;
              if (((pbVar10[-1] & 0xffffffc0) != 0x80) ||
                 (uVar5 = pbVar10[-1] & 0x3f | uVar5 << 6, iVar6 == 0)) break;
              pbVar3 = pbVar10 + 1;
            } while (pbVar10 < pbVar9);
            if (uVar5 < 0x10000) goto LAB_0014444e;
            if ((0x10ffff < uVar5) || (puVar1 <= (ushort *)((long)outb + 2))) break;
            *(ushort *)outb = (ushort)(uVar5 + 0xff0000 >> 10) | 0xd800;
            *(ushort *)((long)outb + 2) = (ushort)uVar5 & 0x3ff | 0xdc00;
            outb = (uchar *)((long)outb + 4);
            in = pbVar10;
          }
          else {
LAB_0014444e:
            if (puVar1 <= outb) break;
            *(ushort *)outb = (ushort)uVar5;
            outb = (uchar *)((long)outb + 2);
            in = pbVar10;
          }
          if (pbVar9 <= in) break;
        } while( true );
      }
      *outlen = (int)outb - iVar8;
      *inlen = (int)in - iVar4;
      return *outlen;
    }
    iVar6 = 0;
    *outlen = 0;
    *inlen = 0;
  }
  return iVar6;
}

Assistant:

static int
UTF8ToUTF16LE(unsigned char* outb, int *outlen,
            const unsigned char* in, int *inlen)
{
    unsigned short* out = (unsigned short*) outb;
    const unsigned char* processed = in;
    const unsigned char *const instart = in;
    unsigned short* outstart= out;
    unsigned short* outend;
    const unsigned char* inend;
    unsigned int c, d;
    int trailing;
    unsigned char *tmp;
    unsigned short tmp1, tmp2;

    /* UTF16LE encoding has no BOM */
    if ((out == NULL) || (outlen == NULL) || (inlen == NULL)) return(-1);
    if (in == NULL) {
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend= in + *inlen;
    outend = out + (*outlen / 2);
    while (in < inend) {
      d= *in++;
      if      (d < 0x80)  { c= d; trailing= 0; }
      else if (d < 0xC0) {
          /* trailing byte in leading position */
	  *outlen = (out - outstart) * 2;
	  *inlen = processed - instart;
	  return(-2);
      } else if (d < 0xE0)  { c= d & 0x1F; trailing= 1; }
      else if (d < 0xF0)  { c= d & 0x0F; trailing= 2; }
      else if (d < 0xF8)  { c= d & 0x07; trailing= 3; }
      else {
	/* no chance for this in UTF-16 */
	*outlen = (out - outstart) * 2;
	*inlen = processed - instart;
	return(-2);
      }

      if (inend - in < trailing) {
          break;
      }

      for ( ; trailing; trailing--) {
          if ((in >= inend) || (((d= *in++) & 0xC0) != 0x80))
	      break;
          c <<= 6;
          c |= d & 0x3F;
      }

      /* assertion: c is a single UTF-4 value */
        if (c < 0x10000) {
            if (out >= outend)
	        break;
	    if (xmlLittleEndian) {
		*out++ = c;
	    } else {
		tmp = (unsigned char *) out;
		*tmp = c ;
		*(tmp + 1) = c >> 8 ;
		out++;
	    }
        }
        else if (c < 0x110000) {
            if (out+1 >= outend)
	        break;
            c -= 0x10000;
	    if (xmlLittleEndian) {
		*out++ = 0xD800 | (c >> 10);
		*out++ = 0xDC00 | (c & 0x03FF);
	    } else {
		tmp1 = 0xD800 | (c >> 10);
		tmp = (unsigned char *) out;
		*tmp = (unsigned char) tmp1;
		*(tmp + 1) = tmp1 >> 8;
		out++;

		tmp2 = 0xDC00 | (c & 0x03FF);
		tmp = (unsigned char *) out;
		*tmp  = (unsigned char) tmp2;
		*(tmp + 1) = tmp2 >> 8;
		out++;
	    }
        }
        else
	    break;
	processed = in;
    }
    *outlen = (out - outstart) * 2;
    *inlen = processed - instart;
    return(*outlen);
}